

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbignum.cpp
# Opt level: O2

int __thiscall
CVmObjBigNum::getp_log10(CVmObjBigNum *this,vm_obj_id_t self,vm_val_t *retval,uint *argc)

{
  ushort uVar1;
  err_frame_t *peVar2;
  CVmException *pCVar3;
  int iVar4;
  char *src;
  undefined8 *puVar5;
  long *plVar6;
  size_t prec;
  uint hdl3;
  uint hdl2;
  uint hdl1;
  char *ext3;
  char *ext2;
  char *ext1;
  char *new_ext;
  err_frame_t err_cur__;
  
  uVar1 = *(ushort *)(this->super_CVmObject).ext_;
  iVar4 = setup_getp_0(this,self,retval,argc,&new_ext);
  if (iVar4 == 0) {
    prec = (ulong)uVar1 + 3;
    src = cache_ln10(prec);
    alloc_temp_regs(prec,3,&ext1,&hdl1,&ext2,&hdl2,&ext3);
    puVar5 = (undefined8 *)_ZTW11G_err_frame();
    err_cur__.prv_ = (err_frame_t *)*puVar5;
    plVar6 = (long *)_ZTW11G_err_frame();
    *plVar6 = (long)&err_cur__;
    err_cur__.state_ = _setjmp((__jmp_buf_tag *)err_cur__.jmpbuf_);
    if (err_cur__.state_ == 0) {
      compute_ln_into(ext1,(this->super_CVmObject).ext_);
      copy_val(ext2,src,1);
      compute_quotient_into(ext3,(char *)0x0,ext1,ext2);
      copy_val(new_ext,ext3,1);
    }
    if (-1 < (short)err_cur__.state_) {
      err_cur__.state_ = err_cur__.state_ | 0x8000;
      release_temp_regs(3,(ulong)hdl1,(ulong)hdl2,(ulong)hdl3);
    }
    peVar2 = err_cur__.prv_;
    puVar5 = (undefined8 *)_ZTW11G_err_frame();
    *puVar5 = peVar2;
    if ((err_cur__.state_ & 0x4001U) != 0) {
      puVar5 = (undefined8 *)_ZTW11G_err_frame();
      if ((*(byte *)*puVar5 & 2) != 0) {
        plVar6 = (long *)_ZTW11G_err_frame();
        free(*(void **)(*plVar6 + 0x10));
      }
      pCVar3 = err_cur__.exc_;
      plVar6 = (long *)_ZTW11G_err_frame();
      *(CVmException **)(*plVar6 + 0x10) = pCVar3;
      err_rethrow();
    }
    if ((err_cur__.state_ & 2U) != 0) {
      free(err_cur__.exc_);
    }
    sp_ = sp_ + -1;
  }
  return 1;
}

Assistant:

int CVmObjBigNum::getp_log10(VMG_ vm_obj_id_t self,
                             vm_val_t *retval, uint *argc)
{
    char *new_ext;
    size_t prec = get_prec(ext_);
    uint hdl1, hdl2, hdl3;
    char *ext1, *ext2, *ext3;
    const char *ln10;

    /* check arguments and set up the result */
    if (setup_getp_0(vmg_ self, retval, argc, &new_ext))
        return TRUE;

    /* cache ln(10) to the required precision */
    ln10 = cache_ln10(prec + 3);

    /* allocate some temporary registers */
    alloc_temp_regs(prec + 3, 3,
                    &ext1, &hdl1, &ext2, &hdl2, &ext3, &hdl3);

    /* catch errors so we can be sure to free registers */
    err_try
    {
        /* compute the natural logarithm of the number */
        compute_ln_into(ext1, ext_);

        /* get ln(10), properly rounded */
        copy_val(ext2, ln10, TRUE);

        /* compute ln(x)/ln(10) to yield log10(x) */
        compute_quotient_into(ext3, 0, ext1, ext2);

        /* store the result, rounding as needed */
        copy_val(new_ext, ext3, TRUE);
    }